

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.c
# Opt level: O1

mat4_t * mat4_lookat(mat4_t *__return_storage_ptr__,vec3_t eye,vec3_t dest,vec3_t up)

{
  mat4_t a;
  mat4_t b;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  mat4_t m_1;
  mat4_t trans;
  
  fVar2 = dest.x - eye.x;
  fVar3 = dest.y - eye.y;
  fVar4 = dest.z - eye.z;
  fVar1 = fVar4 * fVar4 + fVar2 * fVar2 + fVar3 * fVar3;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar2 = fVar2 / fVar1;
  fVar3 = fVar3 / fVar1;
  fVar4 = fVar4 / fVar1;
  fVar6 = fVar3 * up.z - fVar4 * up.y;
  fVar8 = fVar4 * up.x - up.z * fVar2;
  fVar5 = up.y * fVar2 - up.x * fVar3;
  fVar1 = fVar5 * fVar5 + fVar6 * fVar6 + fVar8 * fVar8;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar6 = fVar6 / fVar1;
  fVar8 = fVar8 / fVar1;
  fVar5 = fVar5 / fVar1;
  fVar9 = fVar8 * fVar4 + -fVar3 * fVar5;
  fVar10 = fVar5 * fVar2 - fVar4 * fVar6;
  fVar7 = fVar3 * fVar6 - fVar2 * fVar8;
  fVar1 = fVar7 * fVar7 + fVar9 * fVar9 + fVar10 * fVar10;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  b.m[3][3] = 1.0;
  b.m[3][2] = -eye.z;
  a.m[0][1] = fVar9 / fVar1;
  a.m[0][0] = fVar6;
  a.m[1][1] = fVar10 / fVar1;
  a.m[1][0] = fVar8;
  a.m[2][1] = fVar7 / fVar1;
  a.m[2][0] = fVar5;
  a.m[0][2] = -fVar2;
  a.m[0][3] = 0.0;
  a.m[1][2] = -fVar3;
  a.m[1][3] = 0.0;
  a._40_8_ = (ulong)(uint)fVar4 ^ 0x80000000;
  a._48_8_ = 0;
  a._56_8_ = 0x3f80000000000000;
  b._40_8_ = 0x3f800000;
  b._0_40_ = ZEXT2440(CONCAT816(0x3f80000000000000,ZEXT816(0x3f800000)));
  b._48_8_ = eye._0_8_ ^ 0x8000000080000000;
  mat4_mulm(a,b);
  return __return_storage_ptr__;
}

Assistant:

mat4_t
mat4_lookat(vec3_t eye, vec3_t dest, vec3_t up) {
    vec3_t	f	= vec3_normalize(vec3_sub(dest, eye));
    vec3_t	s	= vec3_normalize(vec3_cross(f, up));
    vec3_t	u	= vec3_normalize(vec3_cross(s, f));

    mat4_t	trans	= mat4_translation(vec3_neg(eye));

    mat4_t	m	= mat4(s.x, u.x, -f.x, 0.0f,
                   s.y, u.y, -f.y, 0.0f,
                   s.z, u.z, -f.z, 0.0f,
                   0.0f, 0.0f, 0.0f, 1.0f);
    return mat4_mulm(m, trans);
}